

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

void wallet::MaybeCompactWalletDB(WalletContext *context)

{
  int iVar1;
  _Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_> _Var2;
  atomic<bool> aVar3;
  char cVar4;
  int64_t iVar5;
  pointer psVar6;
  long in_FS_OFFSET;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  local_40;
  long local_28;
  
  aVar3._M_base._M_i = MaybeCompactWalletDB::fOneThread._M_base._M_i;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  MaybeCompactWalletDB::fOneThread._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  if (((byte)aVar3._M_base._M_i & 1) == 0) {
    GetWallets(&local_40,context);
    for (psVar6 = local_40.
                  super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar6 != local_40.
                  super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar6 = psVar6 + 1) {
      _Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
           (((psVar6->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
      if (_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
          (WalletDatabase *)0x0) {
        __assert_fail("static_cast<bool>(m_database)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                      ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
      }
      iVar1 = *(int *)((long)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>.
                             _M_head_impl + 0xc);
      if (*(int *)((long)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
                  0x10) != iVar1) {
        *(int *)((long)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
                0x10) = iVar1;
        iVar5 = GetTime();
        *(int64_t *)
         ((long)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl + 0x18) =
             iVar5;
      }
      if (*(int *)((long)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
                  0x14) != iVar1) {
        iVar5 = GetTime();
        if (1 < iVar5 - *(long *)((long)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>
                                        ._M_head_impl + 0x18)) {
          cVar4 = (**(code **)(*(long *)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>
                                        ._M_head_impl + 0x48))
                            (_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>.
                             _M_head_impl);
          if (cVar4 != '\0') {
            *(int *)((long)_Var2.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl
                    + 0x14) = iVar1;
          }
        }
      }
    }
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    ~vector(&local_40);
    LOCK();
    MaybeCompactWalletDB::fOneThread._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MaybeCompactWalletDB(WalletContext& context)
{
    static std::atomic<bool> fOneThread(false);
    if (fOneThread.exchange(true)) {
        return;
    }

    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        WalletDatabase& dbh = pwallet->GetDatabase();

        unsigned int nUpdateCounter = dbh.nUpdateCounter;

        if (dbh.nLastSeen != nUpdateCounter) {
            dbh.nLastSeen = nUpdateCounter;
            dbh.nLastWalletUpdate = GetTime();
        }

        if (dbh.nLastFlushed != nUpdateCounter && GetTime() - dbh.nLastWalletUpdate >= 2) {
            if (dbh.PeriodicFlush()) {
                dbh.nLastFlushed = nUpdateCounter;
            }
        }
    }

    fOneThread = false;
}